

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

int QTest::qToInt(char *str)

{
  long lVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  int l;
  char *pEnd;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  lVar1 = strtol(in_RDI,&local_10,10);
  if (*local_10 != '\0') {
    fprintf(_stderr,"Invalid numeric parameter: \'%s\'\n",in_RDI);
    exit(1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)lVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int qToInt(const char *str)
{
    char *pEnd;
    int l = static_cast<int>(strtol(str, &pEnd, 10));
    if (*pEnd != 0) {
        std::fprintf(stderr, "Invalid numeric parameter: '%s'\n", str);
        exit(1);
    }
    return l;
}